

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_diag_avx2_256_64.c
# Opt level: O1

parasail_result_t *
parasail_nw_stats_table_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  ulong uVar1;
  long lVar2;
  int64_t iVar3;
  undefined4 uVar4;
  int *piVar5;
  long lVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  uint uVar20;
  parasail_result_t *ppVar21;
  int64_t *ptr;
  undefined1 (*ptr_00) [16];
  int64_t *ptr_01;
  int64_t *ptr_02;
  int64_t *ptr_03;
  int64_t *ptr_04;
  int64_t *ptr_05;
  int64_t *ptr_06;
  int64_t *ptr_07;
  int64_t *ptr_08;
  long lVar22;
  long lVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  long lVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  int iVar40;
  ulong uVar41;
  int iVar42;
  ulong uVar43;
  ulong uVar44;
  uint uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  int iVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  bool bVar65;
  bool bVar66;
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar94 [64];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [64];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  uint local_51c;
  long local_510;
  long local_508;
  long local_4f0;
  long local_4e8;
  undefined1 local_4a8 [32];
  undefined1 local_468 [32];
  undefined1 local_3d8 [32];
  undefined1 local_3b8 [32];
  undefined1 local_398 [32];
  undefined1 local_378 [32];
  undefined1 local_358 [32];
  undefined1 local_2d8 [32];
  undefined1 local_278 [32];
  undefined1 local_258 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  long local_118;
  long lStack_110;
  long lStack_100;
  undefined1 auVar93 [32];
  
  if (_s2 == (char *)0x0) {
    parasail_nw_stats_table_diag_avx2_256_64_cold_8();
  }
  else {
    uVar59 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_nw_stats_table_diag_avx2_256_64_cold_7();
    }
    else if (open < 0) {
      parasail_nw_stats_table_diag_avx2_256_64_cold_6();
    }
    else {
      uVar57 = CONCAT44(0,gap);
      if (gap < 0) {
        parasail_nw_stats_table_diag_avx2_256_64_cold_5();
      }
      else {
        uVar37 = (ulong)(uint)_s1Len;
        if (matrix == (parasail_matrix_t *)0x0) {
          parasail_nw_stats_table_diag_avx2_256_64_cold_4();
        }
        else {
          if (matrix->type == 1) {
            if (_s1 == (char *)0x0) {
              parasail_nw_stats_table_diag_avx2_256_64_cold_3();
              return (parasail_result_t *)0x0;
            }
          }
          else {
            if (_s1 == (char *)0x0) {
              parasail_nw_stats_table_diag_avx2_256_64_cold_2();
              return (parasail_result_t *)0x0;
            }
            if (_s1Len < 1) {
              parasail_nw_stats_table_diag_avx2_256_64_cold_1();
              return (parasail_result_t *)0x0;
            }
          }
          if (matrix->type != 0) {
            uVar37 = (ulong)(uint)matrix->length;
          }
          iVar40 = -open;
          iVar42 = matrix->min;
          uVar28 = CONCAT44(0,open);
          uVar58 = 0x8000000000000000 - (long)iVar42;
          if (iVar42 != iVar40 && SBORROW4(iVar42,iVar40) == iVar42 + open < 0) {
            uVar58 = uVar28 | 0x8000000000000000;
          }
          iVar42 = matrix->max;
          uVar45 = (uint)uVar37;
          ppVar21 = parasail_result_new_table3(uVar45,s2Len);
          if (ppVar21 != (parasail_result_t *)0x0) {
            iVar25 = uVar45 + 3;
            ppVar21->flag = ppVar21->flag | 0x4831001;
            ptr = parasail_memalign_int64_t(0x20,(long)iVar25);
            uVar33 = (ulong)(s2Len + 6);
            ptr_00 = (undefined1 (*) [16])parasail_memalign_int64_t(0x20,uVar33);
            ptr_01 = parasail_memalign_int64_t(0x20,uVar33);
            ptr_02 = parasail_memalign_int64_t(0x20,uVar33);
            ptr_03 = parasail_memalign_int64_t(0x20,uVar33);
            ptr_04 = parasail_memalign_int64_t(0x20,uVar33);
            ptr_05 = parasail_memalign_int64_t(0x20,uVar33);
            ptr_06 = parasail_memalign_int64_t(0x20,uVar33);
            ptr_07 = parasail_memalign_int64_t(0x20,uVar33);
            ptr_08 = parasail_memalign_int64_t(0x20,uVar33);
            if ((ptr_08 != (int64_t *)0x0 &&
                (ptr_07 != (int64_t *)0x0 && (ptr_06 != (int64_t *)0x0 && ptr_05 != (int64_t *)0x0))
                ) && ((ptr_04 != (int64_t *)0x0 &&
                      (ptr_03 != (int64_t *)0x0 && ptr_02 != (int64_t *)0x0)) &&
                     ((ptr_01 != (int64_t *)0x0 && ptr_00 != (undefined1 (*) [16])0x0) &&
                     ptr != (int64_t *)0x0))) {
              lVar22 = uVar58 + 1;
              lVar29 = 0x7ffffffffffffffe - (long)iVar42;
              auVar91._8_8_ = lVar22;
              auVar91._0_8_ = lVar22;
              auVar93._16_8_ = lVar22;
              auVar93._0_16_ = auVar91;
              auVar93._24_8_ = lVar22;
              auVar92 = vpslldq_avx(auVar91,8);
              uVar20 = gap * 4;
              auVar69._4_4_ = 0;
              auVar69._0_4_ = uVar20;
              lVar32 = (long)(int)uVar45 + -1;
              lVar36 = uVar59 - 1;
              uVar58 = (ulong)iVar40;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = (long)(iVar40 + gap * -2);
              auVar109._8_8_ = 0;
              auVar109._0_8_ = (long)-(gap * 3 + open);
              auVar91 = vpunpcklqdq_avx(auVar109,auVar67);
              auVar110._8_8_ = 0;
              auVar110._0_8_ = (long)(iVar40 - gap);
              auVar112._8_8_ = 0;
              auVar112._0_8_ = uVar58;
              auVar67 = vpunpcklqdq_avx(auVar110,auVar112);
              if (0 < (int)uVar45) {
                piVar5 = matrix->mapper;
                uVar33 = 0;
                do {
                  ptr[uVar33] = (long)piVar5[(byte)_s1[uVar33]];
                  uVar33 = uVar33 + 1;
                } while (uVar37 != uVar33);
              }
              uVar26 = s2Len + 3;
              local_51c = uVar45 - 1;
              iVar27 = s2Len + -1;
              auVar68._16_16_ = ZEXT116(1) * auVar92;
              auVar68._0_16_ = ZEXT116(0) * auVar92;
              auVar69._8_4_ = uVar20;
              auVar69._12_4_ = 0;
              auVar69._16_4_ = uVar20;
              auVar69._20_4_ = 0;
              auVar69._24_4_ = uVar20;
              auVar69._28_4_ = 0;
              local_2d8._0_16_ = ZEXT116(0) * auVar67 + ZEXT116(1) * auVar91;
              local_2d8._16_16_ = ZEXT116(1) * auVar67;
              iVar42 = uVar45 + 1;
              if ((int)(uVar45 + 1) < iVar25) {
                iVar42 = iVar25;
              }
              uVar61 = 0;
              memset(ptr + (int)uVar45,0,(ulong)(~uVar45 + iVar42) * 8 + 8);
              piVar5 = matrix->mapper;
              uVar33 = 1;
              if (1 < s2Len) {
                uVar33 = uVar59;
              }
              do {
                *(long *)(ptr_00[1] + uVar61 * 8 + 8) = (long)piVar5[(byte)_s2[uVar61]];
                uVar61 = uVar61 + 1;
              } while (uVar33 != uVar61);
              *ptr_00 = (undefined1  [16])0x0;
              *(undefined8 *)ptr_00[1] = 0;
              uVar20 = s2Len + 1U;
              if ((int)(s2Len + 1U) < (int)uVar26) {
                uVar20 = uVar26;
              }
              memset(ptr_00[1] + uVar59 * 8 + 8,0,(ulong)(~s2Len + uVar20) * 8 + 8);
              lVar23 = 0;
              do {
                *(ulong *)((long)ptr_01 + lVar23 + 0x18) = uVar58;
                *(undefined8 *)((long)ptr_02 + lVar23 + 0x18) = 0;
                *(undefined8 *)((long)ptr_03 + lVar23 + 0x18) = 0;
                *(undefined8 *)((long)ptr_04 + lVar23 + 0x18) = 0;
                *(long *)((long)ptr_05 + lVar23 + 0x18) = lVar22;
                *(undefined8 *)((long)ptr_06 + lVar23 + 0x18) = 0;
                *(undefined8 *)((long)ptr_07 + lVar23 + 0x18) = 0;
                *(undefined8 *)((long)ptr_08 + lVar23 + 0x18) = 0;
                uVar58 = uVar58 - uVar57;
                lVar23 = lVar23 + 8;
              } while (uVar33 * 8 != lVar23);
              lVar23 = 0;
              do {
                *(undefined8 *)((long)ptr_01 + lVar23) = 0;
                *(undefined8 *)((long)ptr_02 + lVar23) = 0;
                *(undefined8 *)((long)ptr_03 + lVar23) = 0;
                *(undefined8 *)((long)ptr_04 + lVar23) = 0;
                *(undefined8 *)((long)ptr_05 + lVar23) = 0;
                *(undefined8 *)((long)ptr_06 + lVar23) = 0;
                *(undefined8 *)((long)ptr_07 + lVar23) = 0;
                *(undefined8 *)((long)ptr_08 + lVar23) = 0;
                lVar23 = lVar23 + 8;
              } while (lVar23 != 0x18);
              lVar23 = 0;
              do {
                ptr_01[uVar59 + lVar23 + 3] = 0;
                ptr_02[uVar59 + lVar23 + 3] = 0;
                ptr_03[uVar59 + lVar23 + 3] = 0;
                ptr_04[uVar59 + lVar23 + 3] = 0;
                ptr_05[uVar59 + lVar23 + 3] = 0;
                ptr_06[uVar59 + lVar23 + 3] = 0;
                ptr_07[uVar59 + lVar23 + 3] = 0;
                ptr_08[uVar59 + lVar23 + 3] = 0;
                lVar23 = lVar23 + 1;
              } while (s2Len + (int)lVar23 < (int)uVar26);
              ptr_01[2] = 0;
              local_378._8_8_ = lVar29;
              local_378._0_8_ = lVar29;
              local_378._16_8_ = lVar29;
              local_378._24_8_ = lVar29;
              auVar113 = ZEXT3264(auVar93);
              auVar90 = ZEXT3264(auVar93);
              auVar126 = ZEXT3264(auVar93);
              local_3d8 = auVar93;
              local_358 = auVar93;
              if (0 < (int)uVar45) {
                piVar5 = matrix->matrix;
                uVar58 = 1;
                if (1 < (int)uVar26) {
                  uVar58 = (ulong)uVar26;
                }
                lVar23 = uVar59 * 0x10;
                local_4e8 = uVar59 * 4 + -4;
                local_508 = uVar59 * 0xc + -0xc;
                local_510 = uVar59 * 8 + -8;
                auVar12 = vpmovsxbq_avx2(ZEXT416(0x10203));
                local_4f0 = 0;
                auVar113 = ZEXT3264(auVar93);
                auVar126 = ZEXT3264(auVar93);
                auVar90 = ZEXT3264(auVar93);
                uVar33 = 0;
                do {
                  uVar43 = uVar33 | 2;
                  uVar50 = uVar33 | 3;
                  uVar61 = ptr[uVar33 + 3];
                  iVar42 = matrix->type;
                  uVar45 = (uint)uVar33;
                  uVar20 = local_51c;
                  if (uVar50 < uVar37) {
                    uVar20 = uVar45 | 3;
                  }
                  uVar24 = (long)(int)uVar20;
                  if (iVar42 == 0) {
                    uVar24 = uVar61;
                  }
                  uVar20 = uVar45 | 2;
                  if (uVar37 <= uVar43) {
                    uVar20 = local_51c;
                  }
                  uVar31 = ptr[uVar33 + 2];
                  uVar44 = (long)(int)uVar20;
                  if (iVar42 == 0) {
                    uVar44 = uVar31;
                  }
                  uVar45 = uVar45 | 1;
                  if (uVar37 <= (uVar33 | 1)) {
                    uVar45 = local_51c;
                  }
                  uVar47 = ptr[uVar33];
                  uVar54 = ptr[uVar33 + 1];
                  lVar46 = (long)matrix->size;
                  uVar30 = uVar47;
                  if (iVar42 != 0) {
                    uVar30 = uVar33;
                  }
                  uVar51 = (long)(int)uVar45;
                  if (iVar42 == 0) {
                    uVar51 = uVar54;
                  }
                  uVar1 = uVar33 + 4;
                  uVar34 = ptr_01[2];
                  ptr_01[2] = (long)iVar40 - uVar1 * uVar57;
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = uVar47;
                  auVar101._8_8_ = 0;
                  auVar101._0_8_ = uVar54;
                  auVar91 = vpunpcklqdq_avx(auVar101,auVar92);
                  auVar103._8_8_ = 0;
                  auVar103._0_8_ = uVar31;
                  auVar104._8_8_ = 0;
                  auVar104._0_8_ = uVar61;
                  auVar67 = vpunpcklqdq_avx(auVar104,auVar103);
                  auVar67 = ZEXT116(0) * auVar91 + ZEXT116(1) * auVar67;
                  auVar91 = ZEXT116(1) * auVar91;
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = (long)iVar40 - uVar33 * uVar57;
                  auVar92 = vpslldq_avx(auVar95,8);
                  auVar102._16_16_ = ZEXT116(1) * auVar92;
                  auVar102._0_16_ = ZEXT116(0) * auVar92;
                  auVar106._8_8_ = 0;
                  auVar106._0_8_ = uVar34;
                  auVar92 = vpslldq_avx(auVar106,8);
                  local_278._16_16_ = ZEXT116(1) * auVar92;
                  local_278._0_16_ = ZEXT116(0) * auVar92;
                  uVar61 = 0;
                  local_3b8._8_8_ = 0xfffffffffffffffe;
                  local_3b8._0_8_ = 0xfffffffffffffffd;
                  local_3b8._16_8_ = 0xffffffffffffffff;
                  local_3b8._24_8_ = 0;
                  local_4a8._0_8_ = 0;
                  local_4a8._8_8_ = 0;
                  local_4a8._16_8_ = 0;
                  local_4a8._24_8_ = 0;
                  local_468._0_8_ = 0;
                  local_468._8_8_ = 0;
                  local_468._16_8_ = 0;
                  local_468._24_8_ = 0;
                  local_398 = ZEXT1632(ZEXT816(0));
                  auVar118 = ZEXT864(0) << 0x40;
                  auVar132 = ZEXT864(0) << 0x40;
                  auVar108 = ZEXT1664((undefined1  [16])0x0);
                  auVar127 = ZEXT864(0) << 0x40;
                  auVar105 = ZEXT1664((undefined1  [16])0x0);
                  auVar130 = ZEXT864(0) << 0x40;
                  local_218 = ZEXT1632(ZEXT816(0));
                  auVar94 = ZEXT1664((undefined1  [16])0x0);
                  local_238 = ZEXT1632(ZEXT816(0));
                  auVar18 = auVar93;
                  auVar11 = auVar68;
                  local_258 = auVar68;
                  do {
                    auVar7._8_4_ = gap;
                    auVar7._0_8_ = uVar57;
                    auVar7._12_4_ = 0;
                    auVar7._16_4_ = gap;
                    auVar7._20_4_ = 0;
                    auVar7._24_4_ = gap;
                    auVar7._28_4_ = 0;
                    auVar111 = vpsubq_avx2(auVar11,auVar7);
                    auVar11._8_4_ = open;
                    auVar11._0_8_ = uVar28;
                    auVar11._12_4_ = 0;
                    auVar11._16_4_ = open;
                    auVar11._20_4_ = 0;
                    auVar11._24_4_ = open;
                    auVar11._28_4_ = 0;
                    auVar13 = vpsubq_avx2(auVar102,auVar11);
                    auVar11 = vpcmpgtq_avx2(auVar13,auVar111);
                    auVar8 = vblendvpd_avx(auVar108._0_32_,auVar130._0_32_,auVar11);
                    auVar102 = vpermq_avx2(auVar102,0xf9);
                    auVar9 = vblendvpd_avx(auVar132._0_32_,auVar105._0_32_,auVar11);
                    iVar3 = ptr_01[uVar61 + 3];
                    auVar107._8_8_ = iVar3;
                    auVar107._0_8_ = iVar3;
                    auVar107._16_8_ = iVar3;
                    auVar107._24_8_ = iVar3;
                    auVar17 = vpblendd_avx2(auVar102,auVar107,0xc0);
                    auVar10 = vblendvpd_avx(auVar118._0_32_,auVar127._0_32_,auVar11);
                    auVar18 = vpermq_avx2(auVar18,0xf9);
                    lVar6 = *(long *)(ptr_00[1] + uVar61 * 8 + 8);
                    auVar115._8_8_ = lVar6;
                    auVar115._0_8_ = lVar6;
                    auVar115._16_8_ = lVar6;
                    auVar115._24_8_ = lVar6;
                    auVar18 = vpblendd_avx2(auVar18,auVar115,0xc0);
                    local_118 = auVar67._0_8_;
                    auVar116._0_8_ = -(ulong)(auVar18._0_8_ == local_118);
                    lStack_110 = auVar67._8_8_;
                    auVar116._8_8_ = -(ulong)(auVar18._8_8_ == lStack_110);
                    auVar116._16_8_ = -(ulong)(auVar18._16_8_ == auVar91._0_8_);
                    lStack_100 = auVar91._8_8_;
                    auVar116._24_8_ = -(ulong)(auVar18._24_8_ == lStack_100);
                    auVar14 = vpsubq_avx2(local_238,auVar116);
                    auVar102 = vpermpd_avx2(auVar130._0_32_,0xf9);
                    iVar3 = ptr_02[uVar61 + 3];
                    auVar122._8_8_ = iVar3;
                    auVar122._0_8_ = iVar3;
                    auVar122._16_8_ = iVar3;
                    auVar122._24_8_ = iVar3;
                    local_238 = vblendpd_avx(auVar102,auVar122,8);
                    auVar114._8_8_ = 0;
                    auVar114._0_8_ = (long)piVar5[uVar30 * lVar46 + lVar6];
                    auVar119._8_8_ = 0;
                    auVar119._0_8_ =
                         (long)piVar5[uVar51 * lVar46 + *(long *)(ptr_00[1] + uVar61 * 8)];
                    auVar92 = vpunpcklqdq_avx(auVar119,auVar114);
                    auVar120._8_8_ = 0;
                    auVar120._0_8_ =
                         (long)piVar5[uVar44 * lVar46 + *(long *)(*ptr_00 + uVar61 * 8 + 8)];
                    auVar128._8_8_ = 0;
                    auVar128._0_8_ = (long)piVar5[uVar24 * lVar46 + *(long *)(*ptr_00 + uVar61 * 8)]
                    ;
                    auVar109 = vpunpcklqdq_avx(auVar128,auVar120);
                    auVar117._0_16_ = ZEXT116(0) * auVar92 + ZEXT116(1) * auVar109;
                    auVar117._16_16_ = ZEXT116(1) * auVar92;
                    auVar116 = vpaddq_avx2(auVar117,local_278);
                    auVar102 = vpcmpgtq_avx2(auVar117,_DAT_008d4700);
                    auVar122 = vpsubq_avx2(auVar94._0_32_,auVar102);
                    auVar102 = vpermpd_avx2(auVar105._0_32_,0xf9);
                    iVar3 = ptr_03[uVar61 + 3];
                    auVar123._8_8_ = iVar3;
                    auVar123._0_8_ = iVar3;
                    auVar123._16_8_ = iVar3;
                    auVar123._24_8_ = iVar3;
                    auVar7 = vblendpd_avx(auVar102,auVar123,8);
                    auVar102 = vpermpd_avx2(auVar127._0_32_,0xf9);
                    iVar3 = ptr_04[uVar61 + 3];
                    auVar124._8_8_ = iVar3;
                    auVar124._0_8_ = iVar3;
                    auVar124._16_8_ = iVar3;
                    auVar124._24_8_ = iVar3;
                    auVar107 = vblendpd_avx(auVar102,auVar124,8);
                    auVar102 = vpermq_avx2(local_258,0xf9);
                    iVar3 = ptr_05[uVar61 + 3];
                    auVar125._8_8_ = iVar3;
                    auVar125._0_8_ = iVar3;
                    auVar125._16_8_ = iVar3;
                    auVar125._24_8_ = iVar3;
                    auVar117 = vpblendd_avx2(auVar102,auVar125,0xc0);
                    auVar102 = vpermpd_avx2(local_398,0xf9);
                    iVar3 = ptr_06[uVar61 + 3];
                    auVar129._8_8_ = iVar3;
                    auVar129._0_8_ = iVar3;
                    auVar129._16_8_ = iVar3;
                    auVar129._24_8_ = iVar3;
                    auVar102 = vblendpd_avx(auVar102,auVar129,8);
                    auVar11 = vpermpd_avx2(local_468,0xf9);
                    iVar3 = ptr_07[uVar61 + 3];
                    auVar131._8_8_ = iVar3;
                    auVar131._0_8_ = iVar3;
                    auVar131._16_8_ = iVar3;
                    auVar131._24_8_ = iVar3;
                    auVar11 = vblendpd_avx(auVar11,auVar131,8);
                    auVar115 = vpermpd_avx2(local_4a8,0xf9);
                    iVar3 = ptr_08[uVar61 + 3];
                    auVar76._8_8_ = iVar3;
                    auVar76._0_8_ = iVar3;
                    auVar76._16_8_ = iVar3;
                    auVar76._24_8_ = iVar3;
                    auVar115 = vblendpd_avx(auVar115,auVar76,8);
                    auVar15._8_4_ = open;
                    auVar15._0_8_ = uVar28;
                    auVar15._12_4_ = 0;
                    auVar15._16_4_ = open;
                    auVar15._20_4_ = 0;
                    auVar15._24_4_ = open;
                    auVar15._28_4_ = 0;
                    auVar15 = vpsubq_avx2(auVar17,auVar15);
                    uVar34 = vpextrq_avx(auVar15._16_16_,1);
                    auVar16._8_4_ = gap;
                    auVar16._0_8_ = uVar57;
                    auVar16._12_4_ = 0;
                    auVar16._16_4_ = gap;
                    auVar16._20_4_ = 0;
                    auVar16._24_4_ = gap;
                    auVar16._28_4_ = 0;
                    auVar16 = vpsubq_avx2(auVar117,auVar16);
                    uVar52 = vpextrq_avx(auVar15._0_16_,1);
                    uVar54 = vpextrq_avx(auVar16._0_16_,1);
                    auVar117 = vpcmpgtq_avx2(auVar15,auVar16);
                    uVar47 = vpextrq_avx(auVar16._16_16_,1);
                    local_398 = vblendvpd_avx(auVar102,local_238,auVar117);
                    auVar11 = vblendvpd_avx(auVar11,auVar7,auVar117);
                    auVar102 = vblendvpd_avx(auVar115,auVar107,auVar117);
                    uVar31 = auVar16._0_8_;
                    if ((long)auVar16._0_8_ < (long)auVar15._0_8_) {
                      uVar31 = auVar15._0_8_;
                    }
                    uVar38 = vpextrq_avx(auVar13._0_16_,1);
                    uVar62 = vpextrq_avx(auVar13._16_16_,1);
                    if ((long)uVar54 < (long)uVar52) {
                      uVar54 = uVar52;
                    }
                    uVar52 = auVar16._16_8_;
                    if ((long)auVar16._16_8_ < (long)auVar15._16_8_) {
                      uVar52 = auVar15._16_8_;
                    }
                    if ((long)uVar47 < (long)uVar34) {
                      uVar47 = uVar34;
                    }
                    uVar34 = auVar111._0_8_;
                    if ((long)auVar111._0_8_ < (long)auVar13._0_8_) {
                      uVar34 = auVar13._0_8_;
                    }
                    uVar53 = vpextrq_avx(auVar111._0_16_,1);
                    uVar60 = vpextrq_avx(auVar111._16_16_,1);
                    if ((long)uVar53 < (long)uVar38) {
                      uVar53 = uVar38;
                    }
                    uVar38 = auVar111._16_8_;
                    if ((long)auVar111._16_8_ < (long)auVar13._16_8_) {
                      uVar38 = auVar13._16_8_;
                    }
                    if ((long)uVar60 < (long)uVar62) {
                      uVar60 = uVar62;
                    }
                    uVar55 = auVar116._0_8_;
                    uVar62 = uVar55;
                    if ((long)uVar55 <= (long)uVar34) {
                      uVar62 = uVar34;
                    }
                    uVar39 = vpextrq_avx(auVar116._0_16_,1);
                    if ((long)uVar39 <= (long)uVar53) {
                      uVar39 = uVar53;
                    }
                    auVar70._8_8_ = 0;
                    auVar70._0_8_ = uVar47;
                    auVar79._8_8_ = 0;
                    auVar79._0_8_ = uVar52;
                    auVar92 = vpunpcklqdq_avx(auVar79,auVar70);
                    uVar63 = vpextrq_avx(auVar116._16_16_,1);
                    uVar56 = auVar116._16_8_;
                    uVar35 = uVar56;
                    if ((long)uVar56 <= (long)uVar38) {
                      uVar35 = uVar38;
                    }
                    if ((long)uVar63 <= (long)uVar60) {
                      uVar63 = uVar60;
                    }
                    if ((long)uVar62 <= (long)uVar31) {
                      uVar62 = uVar31;
                    }
                    auVar80._8_8_ = 0;
                    auVar80._0_8_ = uVar54;
                    auVar96._8_8_ = 0;
                    auVar96._0_8_ = uVar31;
                    auVar109 = vpunpcklqdq_avx(auVar96,auVar80);
                    if ((long)uVar39 <= (long)uVar54) {
                      uVar39 = uVar54;
                    }
                    local_258._0_16_ = ZEXT116(0) * auVar92 + ZEXT116(1) * auVar109;
                    auVar92 = ZEXT116(1) * auVar92;
                    local_258._16_16_ = auVar92;
                    if ((long)uVar35 <= (long)uVar52) {
                      uVar35 = uVar52;
                    }
                    if ((long)uVar63 <= (long)uVar47) {
                      uVar63 = uVar47;
                    }
                    auVar71._8_8_ = 0;
                    auVar71._0_8_ = uVar63;
                    auVar81._8_8_ = 0;
                    auVar81._0_8_ = uVar35;
                    auVar109 = vpunpcklqdq_avx(auVar81,auVar71);
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = uVar39;
                    auVar97._8_8_ = 0;
                    auVar97._0_8_ = uVar62;
                    auVar110 = vpunpcklqdq_avx(auVar97,auVar82);
                    auVar77._0_16_ = ZEXT116(0) * auVar109 + ZEXT116(1) * auVar110;
                    auVar109 = ZEXT116(1) * auVar109;
                    auVar77._16_16_ = auVar109;
                    auVar89._0_8_ = -(ulong)(auVar77._0_8_ == uVar55);
                    auVar89._8_8_ = -(ulong)(auVar77._8_8_ == auVar116._8_8_);
                    auVar89._16_8_ = -(ulong)(auVar109._0_8_ == uVar56);
                    auVar89._24_8_ = -(ulong)(auVar109._8_8_ == auVar116._24_8_);
                    auVar99._0_8_ = -(ulong)(auVar77._0_8_ == local_258._0_8_);
                    auVar99._8_8_ = -(ulong)(auVar77._8_8_ == local_258._8_8_);
                    auVar99._16_8_ = -(ulong)(auVar109._0_8_ == auVar92._0_8_);
                    auVar99._24_8_ = -(ulong)(auVar109._8_8_ == auVar92._8_8_);
                    auVar115 = vblendvpd_avx(auVar8,local_398,auVar99);
                    auVar115 = vblendvpd_avx(auVar115,auVar14,auVar89);
                    auVar116 = vblendvpd_avx(auVar9,auVar11,auVar99);
                    auVar116 = vblendvpd_avx(auVar116,auVar122,auVar89);
                    auVar117 = vpcmpeqd_avx2(auVar7,auVar7);
                    auVar111 = vpsubq_avx2(local_218,auVar117);
                    auVar13 = vpsubq_avx2(auVar102,auVar117);
                    auVar14 = vpsubq_avx2(auVar10,auVar117);
                    auVar10 = vpcmpeqd_avx2(auVar10,auVar10);
                    auVar102 = vblendvpd_avx(auVar14,auVar13,auVar99);
                    auVar117 = vblendvpd_avx(auVar102,auVar111,auVar89);
                    auVar111._0_8_ = -(ulong)(local_3b8._0_8_ == auVar10._0_8_);
                    auVar111._8_8_ = -(ulong)(local_3b8._8_8_ == auVar10._8_8_);
                    auVar111._16_8_ = -(ulong)(local_3b8._16_8_ == auVar10._16_8_);
                    auVar111._24_8_ = -(ulong)(local_3b8._24_8_ == auVar10._24_8_);
                    auVar102 = vblendvpd_avx(auVar77,local_2d8,auVar111);
                    auVar115 = vandnpd_avx(auVar111,auVar115);
                    auVar130 = ZEXT3264(auVar115);
                    auVar10 = vandnpd_avx(auVar111,auVar116);
                    auVar105 = ZEXT3264(auVar10);
                    auVar116 = vandnpd_avx(auVar111,auVar117);
                    auVar92 = auVar116._0_16_;
                    uVar47 = auVar102._0_8_;
                    uVar52 = auVar115._0_8_;
                    uVar54 = auVar10._0_8_;
                    if (3 < uVar61) {
                      uVar62 = local_378._0_8_;
                      if ((long)uVar47 <= (long)local_378._0_8_) {
                        uVar62 = uVar47;
                      }
                      uVar55 = vpextrq_avx(local_378._0_16_,1);
                      uVar39 = vpextrq_avx(auVar102._0_16_,1);
                      if ((long)uVar39 <= (long)uVar55) {
                        uVar55 = uVar39;
                      }
                      uVar63 = auVar102._16_8_;
                      uVar35 = local_378._16_8_;
                      if ((long)uVar63 <= (long)local_378._16_8_) {
                        uVar35 = uVar63;
                      }
                      uVar56 = vpextrq_avx(local_378._16_16_,1);
                      uVar64 = vpextrq_avx(auVar102._16_16_,1);
                      if ((long)uVar64 <= (long)uVar56) {
                        uVar56 = uVar64;
                      }
                      uVar48 = uVar47;
                      if ((long)uVar47 < (long)local_358._0_8_) {
                        uVar48 = local_358._0_8_;
                      }
                      uVar41 = vpextrq_avx(local_358._0_16_,1);
                      if ((long)uVar39 < (long)uVar41) {
                        uVar39 = uVar41;
                      }
                      if ((long)uVar63 < (long)local_358._16_8_) {
                        uVar63 = local_358._16_8_;
                      }
                      uVar41 = vpextrq_avx(local_358._16_16_,1);
                      if ((long)uVar64 < (long)uVar41) {
                        uVar64 = uVar41;
                      }
                      if ((long)uVar48 <= (long)uVar52) {
                        uVar48 = uVar52;
                      }
                      uVar41 = vpextrq_avx(auVar115._0_16_,1);
                      if ((long)uVar39 <= (long)uVar41) {
                        uVar39 = uVar41;
                      }
                      if ((long)uVar63 <= (long)auVar115._16_8_) {
                        uVar63 = auVar115._16_8_;
                      }
                      uVar41 = vpextrq_avx(auVar115._16_16_,1);
                      if ((long)uVar64 <= (long)uVar41) {
                        uVar64 = uVar41;
                      }
                      if ((long)uVar48 <= (long)uVar54) {
                        uVar48 = uVar54;
                      }
                      auVar72._8_8_ = 0;
                      auVar72._0_8_ = uVar56;
                      auVar83._8_8_ = 0;
                      auVar83._0_8_ = uVar35;
                      auVar109 = vpunpcklqdq_avx(auVar83,auVar72);
                      uVar35 = vpextrq_avx(auVar10._0_16_,1);
                      if ((long)uVar39 <= (long)uVar35) {
                        uVar39 = uVar35;
                      }
                      if ((long)uVar63 <= (long)auVar10._16_8_) {
                        uVar63 = auVar10._16_8_;
                      }
                      uVar35 = vpextrq_avx(auVar10._16_16_,1);
                      if ((long)uVar64 <= (long)uVar35) {
                        uVar64 = uVar35;
                      }
                      if ((long)uVar48 <= (long)auVar116._0_8_) {
                        uVar48 = auVar116._0_8_;
                      }
                      uVar35 = vpextrq_avx(auVar92,1);
                      if ((long)uVar39 <= (long)uVar35) {
                        uVar39 = uVar35;
                      }
                      if ((long)uVar63 <= (long)auVar116._16_8_) {
                        uVar63 = auVar116._16_8_;
                      }
                      uVar35 = vpextrq_avx(auVar116._16_16_,1);
                      auVar73._8_8_ = 0;
                      auVar73._0_8_ = uVar55;
                      auVar84._8_8_ = 0;
                      auVar84._0_8_ = uVar62;
                      auVar110 = vpunpcklqdq_avx(auVar84,auVar73);
                      if ((long)uVar64 <= (long)uVar35) {
                        uVar64 = uVar35;
                      }
                      local_378._0_16_ = ZEXT116(0) * auVar109 + ZEXT116(1) * auVar110;
                      local_378._16_16_ = ZEXT116(1) * auVar109;
                      auVar74._8_8_ = 0;
                      auVar74._0_8_ = uVar64;
                      auVar85._8_8_ = 0;
                      auVar85._0_8_ = uVar63;
                      auVar109 = vpunpcklqdq_avx(auVar85,auVar74);
                      auVar86._8_8_ = 0;
                      auVar86._0_8_ = uVar39;
                      auVar121._8_8_ = 0;
                      auVar121._0_8_ = uVar48;
                      auVar110 = vpunpcklqdq_avx(auVar121,auVar86);
                      local_358._0_16_ = ZEXT116(0) * auVar109 + ZEXT116(1) * auVar110;
                      local_358._16_16_ = ZEXT116(1) * auVar109;
                    }
                    auVar127 = ZEXT3264(auVar116);
                    lVar6 = *((ppVar21->field_4).trace)->trace_del_table;
                    if (uVar61 < uVar59) {
                      *(int *)(local_4f0 + lVar6 + uVar61 * 4) = auVar102._24_4_;
                    }
                    bVar65 = (uVar33 | 1) < uVar37;
                    bVar66 = uVar61 - 1 < uVar59;
                    if (bVar66 && bVar65) {
                      *(int *)(local_4e8 + lVar6 + uVar61 * 4) = auVar102._16_4_;
                    }
                    if ((uVar43 < uVar37) && ((long)(uVar61 - 2) < (long)uVar59 && 1 < uVar61)) {
                      *(int *)(local_510 + lVar6 + uVar61 * 4) = auVar102._8_4_;
                    }
                    lVar2 = uVar61 - 3;
                    if ((uVar50 < uVar37) && (lVar2 < (long)uVar59 && 2 < uVar61)) {
                      *(int *)(lVar6 + local_508 + uVar61 * 4) = auVar102._0_4_;
                    }
                    lVar6 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 8);
                    if (uVar61 < uVar59) {
                      *(int *)(local_4f0 + lVar6 + uVar61 * 4) = auVar115._24_4_;
                    }
                    if (bVar66 && bVar65) {
                      *(int *)(local_4e8 + lVar6 + uVar61 * 4) = auVar115._16_4_;
                    }
                    if ((uVar43 < uVar37) && ((long)(uVar61 - 2) < (long)uVar59 && 1 < uVar61)) {
                      *(int *)(local_510 + lVar6 + uVar61 * 4) = auVar115._8_4_;
                    }
                    local_468._0_8_ = auVar11._0_8_;
                    local_468._8_8_ = auVar11._8_8_;
                    local_468._16_8_ = auVar11._16_8_;
                    local_468._24_8_ = auVar11._24_8_;
                    if ((uVar50 < uVar37) && (lVar2 < (long)uVar59 && 2 < uVar61)) {
                      *(int *)(lVar6 + local_508 + uVar61 * 4) = auVar115._0_4_;
                    }
                    lVar6 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x10);
                    if (uVar61 < uVar59) {
                      *(int *)(local_4f0 + lVar6 + uVar61 * 4) = auVar10._24_4_;
                    }
                    if (bVar66 && bVar65) {
                      *(int *)(local_4e8 + lVar6 + uVar61 * 4) = auVar10._16_4_;
                    }
                    if ((uVar43 < uVar37) && ((long)(uVar61 - 2) < (long)uVar59 && 1 < uVar61)) {
                      *(int *)(local_510 + lVar6 + uVar61 * 4) = auVar10._8_4_;
                    }
                    if ((uVar50 < uVar37) && (lVar2 < (long)uVar59 && 2 < uVar61)) {
                      *(int *)(lVar6 + local_508 + uVar61 * 4) = auVar10._0_4_;
                    }
                    lVar6 = *(long *)((long)((ppVar21->field_4).trace)->trace_del_table + 0x18);
                    if (uVar61 < uVar59) {
                      *(int *)(local_4f0 + lVar6 + uVar61 * 4) = auVar116._24_4_;
                    }
                    if (bVar66 && bVar65) {
                      *(int *)(local_4e8 + lVar6 + uVar61 * 4) = auVar116._16_4_;
                    }
                    if ((uVar43 < uVar37) && ((long)(uVar61 - 2) < (long)uVar59 && 1 < uVar61)) {
                      uVar4 = vextractps_avx(auVar92,2);
                      *(undefined4 *)(local_510 + lVar6 + uVar61 * 4) = uVar4;
                    }
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ = uVar60;
                    auVar87._8_8_ = 0;
                    auVar87._0_8_ = uVar38;
                    auVar109 = vpunpcklqdq_avx(auVar87,auVar75);
                    auVar88._8_8_ = 0;
                    auVar88._0_8_ = uVar53;
                    auVar98._8_8_ = 0;
                    auVar98._0_8_ = uVar34;
                    auVar110 = vpunpcklqdq_avx(auVar98,auVar88);
                    auVar100._0_16_ = ZEXT116(0) * auVar109 + ZEXT116(1) * auVar110;
                    auVar100._16_16_ = ZEXT116(1) * auVar109;
                    if ((uVar50 < uVar37) && (lVar2 < (long)uVar59 && 2 < uVar61)) {
                      *(int *)(lVar6 + local_508 + uVar61 * 4) = auVar116._0_4_;
                    }
                    auVar78._0_8_ = -(ulong)(local_3b8._0_8_ == lVar36);
                    auVar78._8_8_ = -(ulong)(local_3b8._8_8_ == lVar36);
                    auVar78._16_8_ = -(ulong)(local_3b8._16_8_ == lVar36);
                    auVar78._24_8_ = -(ulong)(local_3b8._24_8_ == lVar36);
                    auVar19._8_8_ = -(ulong)(auVar12._8_8_ == lVar32);
                    auVar19._0_8_ = -(ulong)(auVar12._0_8_ == lVar32);
                    auVar19._16_8_ = -(ulong)(auVar12._16_8_ == lVar32);
                    auVar19._24_8_ = -(ulong)(auVar12._24_8_ == lVar32);
                    auVar117 = vpand_avx2(auVar78,auVar19);
                    local_3d8 = vblendvpd_avx(local_3d8,auVar102,auVar117);
                    auVar11 = vblendvpd_avx(auVar90._0_32_,auVar115,auVar117);
                    auVar90 = ZEXT3264(auVar11);
                    auVar11 = vblendvpd_avx(auVar126._0_32_,auVar10,auVar117);
                    auVar126 = ZEXT3264(auVar11);
                    auVar11 = vblendvpd_avx(auVar113._0_32_,auVar116,auVar117);
                    auVar113 = ZEXT3264(auVar11);
                    auVar11 = vblendvpd_avx(auVar100,auVar93,auVar111);
                    auVar115 = vpandn_avx2(auVar111,auVar8);
                    auVar108 = ZEXT3264(auVar115);
                    ptr_01[uVar61] = uVar47;
                    ptr_02[uVar61] = uVar52;
                    ptr_03[uVar61] = uVar54;
                    iVar3 = vmovlpd_avx(auVar92);
                    ptr_04[uVar61] = iVar3;
                    auVar115 = vandnpd_avx(auVar111,auVar9);
                    auVar132 = ZEXT3264(auVar115);
                    ptr_05[uVar61] = uVar31;
                    iVar3 = vmovlps_avx(local_398._0_16_);
                    ptr_06[uVar61] = iVar3;
                    ptr_07[uVar61] = local_468._0_8_;
                    local_4a8._0_8_ = auVar13._0_8_;
                    local_4a8._8_8_ = auVar13._8_8_;
                    local_4a8._16_8_ = auVar13._16_8_;
                    local_4a8._24_8_ = auVar13._24_8_;
                    ptr_08[uVar61] = local_4a8._0_8_;
                    auVar115 = vandnpd_avx(auVar111,auVar14);
                    auVar118 = ZEXT3264(auVar115);
                    auVar115 = vpcmpeqd_avx2(auVar117,auVar117);
                    local_3b8 = vpsubq_avx2(local_3b8,auVar115);
                    uVar61 = uVar61 + 1;
                    auVar94 = ZEXT3264(auVar7);
                    local_278 = auVar17;
                    local_218 = auVar107;
                  } while (uVar58 != uVar61);
                  auVar18._8_8_ = 4;
                  auVar18._0_8_ = 4;
                  auVar18._16_8_ = 4;
                  auVar18._24_8_ = 4;
                  auVar12 = vpaddq_avx2(auVar12,auVar18);
                  local_2d8 = vpsubq_avx2(local_2d8,auVar69);
                  local_4f0 = local_4f0 + lVar23;
                  local_4e8 = local_4e8 + lVar23;
                  local_508 = local_508 + lVar23;
                  local_510 = local_510 + lVar23;
                  uVar33 = uVar1;
                } while (uVar1 < uVar37);
              }
              iVar42 = 4;
              lVar32 = lVar22;
              lVar36 = lVar22;
              lVar23 = lVar22;
              do {
                lVar46 = vpextrq_avx(local_3d8._16_16_,1);
                if (lVar36 < lVar46) {
                  lVar32 = vpextrq_avx(auVar90._16_16_,1);
                  lVar22 = vpextrq_avx(auVar126._16_16_,1);
                  lVar23 = vpextrq_avx(auVar113._16_16_,1);
                  lVar36 = lVar46;
                }
                iVar49 = (int)lVar23;
                iVar40 = (int)lVar22;
                iVar25 = (int)lVar32;
                auVar69 = vperm2i128_avx2(local_3d8,local_3d8,8);
                local_3d8 = vpalignr_avx2(local_3d8,auVar69,8);
                auVar68 = auVar90._0_32_;
                auVar69 = vperm2i128_avx2(auVar68,auVar68,8);
                auVar69 = vpalignr_avx2(auVar68,auVar69,8);
                auVar90 = ZEXT3264(auVar69);
                auVar68 = auVar126._0_32_;
                auVar69 = vperm2i128_avx2(auVar68,auVar68,8);
                auVar69 = vpalignr_avx2(auVar68,auVar69,8);
                auVar126 = ZEXT3264(auVar69);
                auVar68 = auVar113._0_32_;
                auVar69 = vperm2i128_avx2(auVar68,auVar68,8);
                auVar69 = vpalignr_avx2(auVar68,auVar69,8);
                auVar113 = ZEXT3264(auVar69);
                iVar42 = iVar42 + -1;
              } while (iVar42 != 0);
              auVar69 = vpcmpgtq_avx2(auVar93,local_378);
              auVar12._8_8_ = lVar29;
              auVar12._0_8_ = lVar29;
              auVar12._16_8_ = lVar29;
              auVar12._24_8_ = lVar29;
              auVar93 = vpcmpgtq_avx2(local_358,auVar12);
              auVar69 = vpor_avx2(auVar93,auVar69);
              if ((((auVar69 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   SUB321(auVar69 >> 0x7f,0) != '\0') || SUB321(auVar69 >> 0xbf,0) != '\0') ||
                  auVar69[0x1f] < '\0') {
                *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
                lVar36 = 0;
                iVar25 = 0;
                iVar40 = 0;
                iVar49 = 0;
                iVar27 = 0;
                local_51c = 0;
              }
              ppVar21->score = (int)lVar36;
              ppVar21->end_query = local_51c;
              ppVar21->end_ref = iVar27;
              ((ppVar21->field_4).stats)->matches = iVar25;
              ((ppVar21->field_4).stats)->similar = iVar40;
              ((ppVar21->field_4).stats)->length = iVar49;
              parasail_free(ptr_08);
              parasail_free(ptr_07);
              parasail_free(ptr_06);
              parasail_free(ptr_05);
              parasail_free(ptr_04);
              parasail_free(ptr_03);
              parasail_free(ptr_02);
              parasail_free(ptr_01);
              parasail_free(ptr_00);
              parasail_free(ptr);
              return ppVar21;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _HM_pr = NULL;
    int64_t * restrict _HS_pr = NULL;
    int64_t * restrict _HL_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict _FM_pr = NULL;
    int64_t * restrict _FS_pr = NULL;
    int64_t * restrict _FL_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict HM_pr = NULL;
    int64_t * restrict HS_pr = NULL;
    int64_t * restrict HL_pr = NULL;
    int64_t * restrict F_pr = NULL;
    int64_t * restrict FM_pr = NULL;
    int64_t * restrict FS_pr = NULL;
    int64_t * restrict FL_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vNegInf0;
    __m256i vOne;
    __m256i vN;
    __m256i vGapN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vILimit;
    __m256i vILimit1;
    __m256i vJLimit;
    __m256i vJLimit1;
    __m256i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_PSSM) {
        PARASAIL_CHECK_NULL_PSSM_STATS(_s1);
    }
    else {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    matches = NEG_LIMIT;
    similar = NEG_LIMIT;
    length = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vNegInf0 = _mm256_insert_epi64_rpl(vZero, NEG_LIMIT, 3);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vGapN = _mm256_set1_epi64x_rpl(gap*N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vMaxM = vNegInf;
    vMaxS = vNegInf;
    vMaxL = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm256_sub_epi64(vILimit, vOne);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm256_sub_epi64(vJLimit, vOne);
    vIBoundary = _mm256_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap,
            -open-2*gap,
            -open-3*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(s1Len, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s1     = parasail_memalign_int64_t(32, s1Len+PAD);
    s2B    = parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _HL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr  = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FM_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FS_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _FL_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    HM_pr = _HM_pr+PAD;
    HS_pr = _HS_pr+PAD;
    HL_pr = _HL_pr+PAD;
    F_pr = _F_pr+PAD;
    FM_pr = _FM_pr+PAD;
    FS_pr = _FS_pr+PAD;
    FL_pr = _FL_pr+PAD;

    /* validate heap variables */
    if (!s1) return NULL;
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_HM_pr) return NULL;
    if (!_HS_pr) return NULL;
    if (!_HL_pr) return NULL;
    if (!_F_pr) return NULL;
    if (!_FM_pr) return NULL;
    if (!_FS_pr) return NULL;
    if (!_FL_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    for (i=0; i<s1Len; ++i) {
        s1[i] = matrix->mapper[(unsigned char)_s1[i]];
    }
    /* pad back of s1 with dummy values */
    for (i=s1Len; i<s1Len_PAD; ++i) {
        s1[i] = 0; /* point to first matrix row because we don't care */
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = -open - j*gap;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = 0;
        HM_pr[j] = 0;
        HS_pr[j] = 0;
        HL_pr[j] = 0;
        F_pr[j] = 0;
        FM_pr[j] = 0;
        FS_pr[j] = 0;
        FL_pr[j] = 0;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i case1 = vZero;
        __m256i case2 = vZero;
        __m256i vNH = vZero;
        __m256i vNM = vZero;
        __m256i vNS = vZero;
        __m256i vNL = vZero;
        __m256i vWH = vZero;
        __m256i vWM = vZero;
        __m256i vWS = vZero;
        __m256i vWL = vZero;
        __m256i vE = vNegInf0;
        __m256i vE_opn = vNegInf;
        __m256i vE_ext = vNegInf;
        __m256i vEM = vZero;
        __m256i vES = vZero;
        __m256i vEL = vZero;
        __m256i vF = vNegInf0;
        __m256i vF_opn = vNegInf;
        __m256i vF_ext = vNegInf;
        __m256i vFM = vZero;
        __m256i vFS = vZero;
        __m256i vFL = vZero;
        __m256i vJ = vJreset;
        __m256i vs1 = _mm256_set_epi64x_rpl(
                s1[i+0],
                s1[i+1],
                s1[i+2],
                s1[i+3]);
        __m256i vs2 = vNegInf;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        vNH = _mm256_insert_epi64_rpl(vNH, H_pr[-1], 3);
        vWH = _mm256_insert_epi64_rpl(vWH, -open - i*gap, 3);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            __m256i vNWM = vNM;
            __m256i vNWS = vNS;
            __m256i vNWL = vNL;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vNM = _mm256_srli_si256_rpl(vWM, 8);
            vNM = _mm256_insert_epi64_rpl(vNM, HM_pr[j], 3);
            vNS = _mm256_srli_si256_rpl(vWS, 8);
            vNS = _mm256_insert_epi64_rpl(vNS, HS_pr[j], 3);
            vNL = _mm256_srli_si256_rpl(vWL, 8);
            vNL = _mm256_insert_epi64_rpl(vNL, HL_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vFM = _mm256_srli_si256_rpl(vFM, 8);
            vFM = _mm256_insert_epi64_rpl(vFM, FM_pr[j], 3);
            vFS = _mm256_srli_si256_rpl(vFS, 8);
            vFS = _mm256_insert_epi64_rpl(vFS, FS_pr[j], 3);
            vFL = _mm256_srli_si256_rpl(vFL, 8);
            vFL = _mm256_insert_epi64_rpl(vFL, FL_pr[j], 3);
            vF_opn = _mm256_sub_epi64(vNH, vOpen);
            vF_ext = _mm256_sub_epi64(vF, vGap);
            vF = _mm256_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi64(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vNM, case1);
            vFS = _mm256_blendv_epi8(vFS, vNS, case1);
            vFL = _mm256_blendv_epi8(vFL, vNL, case1);
            vFL = _mm256_add_epi64(vFL, vOne);
            vE_opn = _mm256_sub_epi64(vWH, vOpen);
            vE_ext = _mm256_sub_epi64(vE, vGap);
            vE = _mm256_max_epi64_rpl(vE_opn, vE_ext);
            case1 = _mm256_cmpgt_epi64(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vWM, case1);
            vES = _mm256_blendv_epi8(vES, vWS, case1);
            vEL = _mm256_blendv_epi8(vEL, vWL, case1);
            vEL = _mm256_add_epi64(vEL, vOne);
            vs2 = _mm256_srli_si256_rpl(vs2, 8);
            vs2 = _mm256_insert_epi64_rpl(vs2, s2[j], 3);
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            case1 = _mm256_cmpeq_epi64(vWH, vNWH);
            case2 = _mm256_cmpeq_epi64(vWH, vF);
            vWM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    _mm256_add_epi64(vNWM,
                        _mm256_and_si256(
                            _mm256_cmpeq_epi64(vs1,vs2),
                            vOne)),
                    case1);
            vWS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    _mm256_add_epi64(vNWS,
                        _mm256_and_si256(
                            _mm256_cmpgt_epi64(vMat,vZero),
                            vOne)),
                    case1);
            vWL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    _mm256_add_epi64(vNWL, vOne), case1);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_blendv_epi8(vWH, vIBoundary, cond);
                vWM = _mm256_andnot_si256(cond, vWM);
                vWS = _mm256_andnot_si256(cond, vWS);
                vWL = _mm256_andnot_si256(cond, vWL);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
                vEM = _mm256_andnot_si256(cond, vEM);
                vES = _mm256_andnot_si256(cond, vES);
                vEL = _mm256_andnot_si256(cond, vEL);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWM);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWS);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWL);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vWH, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vWM, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vWS, i, s1Len, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vWL, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->stats->rowcols->score_row,   result->stats->rowcols->score_col, vWH, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->matches_row, result->stats->rowcols->matches_col, vWM, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->similar_row, result->stats->rowcols->similar_col, vWS, i, s1Len, j, s2Len);
            arr_store_rowcol(result->stats->rowcols->length_row,  result->stats->rowcols->length_col, vWL, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            HM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWM,0);
            HS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWS,0);
            HL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWL,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            FM_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFM,0);
            FS_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFS,0);
            FL_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vFL,0);
            /* as minor diagonal vector passes across table, extract
               last table value at the i,j bound */
            {
                __m256i cond_valid_I = _mm256_cmpeq_epi64(vI, vILimit1);
                __m256i cond_valid_J = _mm256_cmpeq_epi64(vJ, vJLimit1);
                __m256i cond_all = _mm256_and_si256(cond_valid_I, cond_valid_J);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vMaxM = _mm256_blendv_epi8(vMaxM, vWM, cond_all);
                vMaxS = _mm256_blendv_epi8(vMaxS, vWS, cond_all);
                vMaxL = _mm256_blendv_epi8(vMaxL, vWL, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
        vIBoundary = _mm256_sub_epi64(vIBoundary, vGapN);
    }

    /* max in vMaxH */
    for (i=0; i<N; ++i) {
        int64_t value;
        value = (int64_t) _mm256_extract_epi64_rpl(vMaxH, 3);
        if (value > score) {
            score = value;
            matches = (int64_t) _mm256_extract_epi64_rpl(vMaxM, 3);
            similar = (int64_t) _mm256_extract_epi64_rpl(vMaxS, 3);
            length= (int64_t) _mm256_extract_epi64_rpl(vMaxL, 3);
        }
        vMaxH = _mm256_slli_si256_rpl(vMaxH, 8);
        vMaxM = _mm256_slli_si256_rpl(vMaxM, 8);
        vMaxS = _mm256_slli_si256_rpl(vMaxS, 8);
        vMaxL = _mm256_slli_si256_rpl(vMaxL, 8);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(_FL_pr);
    parasail_free(_FS_pr);
    parasail_free(_FM_pr);
    parasail_free(_F_pr);
    parasail_free(_HL_pr);
    parasail_free(_HS_pr);
    parasail_free(_HM_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    parasail_free(s1);

    return result;
}